

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O2

void __thiscall diligent_spirv_cross::Compiler::analyze_interlocked_resource_usage(Compiler *this)

{
  bool bVar1;
  ExecutionModel EVar2;
  SPIREntryPoint *pSVar3;
  SPIRFunction *pSVar4;
  InterlockedResourceAccessPrepassHandler prepass_handler;
  InterlockedResourceAccessHandler handler;
  InterlockedResourceAccessPrepassHandler local_c0;
  InterlockedResourceAccessHandler local_68;
  
  EVar2 = get_execution_model(this);
  if (EVar2 == ExecutionModelFragment) {
    pSVar3 = get_entry_point(this);
    bVar1 = Bitset::get(&pSVar3->flags,0x14f6);
    if (!bVar1) {
      pSVar3 = get_entry_point(this);
      bVar1 = Bitset::get(&pSVar3->flags,0x14f7);
      if (!bVar1) {
        pSVar3 = get_entry_point(this);
        bVar1 = Bitset::get(&pSVar3->flags,0x14f8);
        if (!bVar1) {
          pSVar3 = get_entry_point(this);
          bVar1 = Bitset::get(&pSVar3->flags,0x14f9);
          if (!bVar1) {
            return;
          }
        }
      }
    }
    InterlockedResourceAccessPrepassHandler::InterlockedResourceAccessPrepassHandler
              (&local_c0,this,(this->ir).default_entry_point.id);
    pSVar4 = get<diligent_spirv_cross::SPIRFunction>(this,(this->ir).default_entry_point.id);
    traverse_all_reachable_opcodes(this,pSVar4,&local_c0.super_OpcodeHandler);
    InterlockedResourceAccessHandler::InterlockedResourceAccessHandler
              (&local_68,this,(this->ir).default_entry_point.id);
    local_68.interlock_function_id = local_c0.interlock_function_id;
    local_68.split_function_case = local_c0.split_function_case;
    local_68.control_flow_interlock = local_c0.control_flow_interlock;
    local_68.use_critical_section = (bool)0;
    if (local_c0.split_function_case == false) {
      local_68.use_critical_section = (bool)(local_c0.control_flow_interlock ^ 1);
    }
    pSVar4 = get<diligent_spirv_cross::SPIRFunction>(this,(this->ir).default_entry_point.id);
    traverse_all_reachable_opcodes(this,pSVar4,&local_68.super_OpcodeHandler);
    this->interlocked_is_complex =
         (bool)(local_68.use_critical_section ^ 1U |
               local_68.interlock_function_id != (this->ir).default_entry_point.id);
    InterlockedResourceAccessHandler::~InterlockedResourceAccessHandler(&local_68);
    InterlockedResourceAccessPrepassHandler::~InterlockedResourceAccessPrepassHandler(&local_c0);
  }
  return;
}

Assistant:

void Compiler::analyze_interlocked_resource_usage()
{
	if (get_execution_model() == ExecutionModelFragment &&
	    (get_entry_point().flags.get(ExecutionModePixelInterlockOrderedEXT) ||
	     get_entry_point().flags.get(ExecutionModePixelInterlockUnorderedEXT) ||
	     get_entry_point().flags.get(ExecutionModeSampleInterlockOrderedEXT) ||
	     get_entry_point().flags.get(ExecutionModeSampleInterlockUnorderedEXT)))
	{
		InterlockedResourceAccessPrepassHandler prepass_handler(*this, ir.default_entry_point);
		traverse_all_reachable_opcodes(get<SPIRFunction>(ir.default_entry_point), prepass_handler);

		InterlockedResourceAccessHandler handler(*this, ir.default_entry_point);
		handler.interlock_function_id = prepass_handler.interlock_function_id;
		handler.split_function_case = prepass_handler.split_function_case;
		handler.control_flow_interlock = prepass_handler.control_flow_interlock;
		handler.use_critical_section = !handler.split_function_case && !handler.control_flow_interlock;

		traverse_all_reachable_opcodes(get<SPIRFunction>(ir.default_entry_point), handler);

		// For GLSL. If we hit any of these cases, we have to fall back to conservative approach.
		interlocked_is_complex =
		    !handler.use_critical_section || handler.interlock_function_id != ir.default_entry_point;
	}
}